

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

aspa_store_node ** aspa_store_get_node(aspa_store_node **node,rtr_socket *rtr_socket)

{
  long in_FS_OFFSET;
  rtr_socket *rtr_socket_local;
  aspa_store_node **node_local;
  
  if (((node == (aspa_store_node **)0x0) || (*node == (aspa_store_node *)0x0)) ||
     (rtr_socket_local = (rtr_socket *)node, rtr_socket == (rtr_socket *)0x0)) {
    node_local = (aspa_store_node **)0x0;
  }
  else {
    for (; rtr_socket_local->tr_socket != (tr_socket *)0x0;
        rtr_socket_local = (rtr_socket *)&rtr_socket_local->tr_socket->close_fp) {
      if ((rtr_socket *)rtr_socket_local->tr_socket->open_fp == rtr_socket) {
        node_local = (aspa_store_node **)rtr_socket_local;
        goto LAB_0011182f;
      }
    }
    node_local = (aspa_store_node **)0x0;
  }
LAB_0011182f:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return node_local;
}

Assistant:

static struct aspa_store_node **aspa_store_get_node(struct aspa_store_node **node, const struct rtr_socket *rtr_socket)
{
	if (!node || !*node || !rtr_socket)
		return NULL;

	while (*node) {
		if ((*node)->rtr_socket == rtr_socket)
			return node;
		node = &(*node)->next;
	}

	return NULL;
}